

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

ZSTD_compressionParameters *
duckdb_zstd::ZSTD_adjustCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_compressionParameters cPar,
          unsigned_long_long srcSize,size_t dictSize,ZSTD_cParamMode_e mode,
          ZSTD_paramSwitch_e useRowMatchFinder)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ZSTD_compressionParameters ZVar3;
  uint uVar4;
  unsigned_long_long uVar5;
  uint uVar6;
  ulong uVar7;
  
  ZVar3 = cPar;
  if (mode == ZSTD_cpm_attachDict) {
    dictSize = 0;
  }
  else if (mode == ZSTD_cpm_createCDict) {
    uVar5 = 0x201;
    if (dictSize == 0) {
      uVar5 = srcSize;
    }
    if (srcSize == 0xffffffffffffffff) {
      srcSize = uVar5;
    }
  }
  if (dictSize < 0x40000001 && srcSize < 0x40000001) {
    uVar6 = (int)(srcSize + dictSize) - 1;
    uVar4 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar6 = 6;
    if (0x3f < srcSize + dictSize) {
      uVar6 = (uVar4 ^ 0xffffffe0) + 0x21;
    }
    if (uVar6 < cPar.windowLog) {
      cPar.windowLog = uVar6;
    }
  }
  if (srcSize != 0xffffffffffffffff) {
    uVar4 = cPar.windowLog;
    if ((dictSize != 0) && (uVar7 = 1L << ((byte)cPar.windowLog & 0x3f), uVar7 < srcSize + dictSize)
       ) {
      uVar7 = uVar7 + dictSize;
      uVar4 = 0x1f;
      if (uVar7 < 0x80000000) {
        uVar6 = (int)uVar7 - 1;
        uVar4 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar4 = (uVar4 ^ 0xffffffe0) + 0x21;
      }
    }
    uVar6 = (cPar.chainLog - 1) + (uint)(cPar.strategy < ZSTD_btlazy2);
    if (uVar4 + 1 < cPar.hashLog) {
      cPar.hashLog = uVar4 + 1;
    }
    if (uVar4 < uVar6) {
      cPar.chainLog = (cPar.chainLog + uVar4) - uVar6;
    }
  }
  if (cPar.windowLog < 10) {
    cPar.windowLog = 10;
  }
  if ((mode == ZSTD_cpm_createCDict) && (0xfffffffd < cPar.strategy - ZSTD_greedy)) {
    if (0x18 < cPar.hashLog) {
      cPar.hashLog = 0x18;
    }
    if (0x18 < cPar.chainLog) {
      cPar.chainLog = 0x18;
    }
  }
  if ((useRowMatchFinder < ZSTD_ps_disable) && (0xfffffffc < cPar.strategy - ZSTD_btlazy2)) {
    uVar4 = 6;
    if (cPar.searchLog < 6) {
      uVar4 = cPar.searchLog;
    }
    uVar6 = 4;
    if (4 < uVar4) {
      uVar6 = uVar4;
    }
    if ((uVar6 | 0x18) < cPar.hashLog) {
      cPar.hashLog = uVar6 | 0x18;
    }
  }
  uVar1 = ZVar3._12_8_;
  uVar2 = ZVar3._20_8_;
  __return_storage_ptr__->searchLog = (int)uVar1;
  __return_storage_ptr__->minMatch = (int)((ulong)uVar1 >> 0x20);
  __return_storage_ptr__->targetLength = (int)uVar2;
  __return_storage_ptr__->strategy = (int)((ulong)uVar2 >> 0x20);
  __return_storage_ptr__->windowLog = cPar.windowLog;
  __return_storage_ptr__->chainLog = cPar.chainLog;
  __return_storage_ptr__->hashLog = cPar.hashLog;
  __return_storage_ptr__->searchLog = cPar.searchLog;
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters
ZSTD_adjustCParams_internal(ZSTD_compressionParameters cPar,
                            unsigned long long srcSize,
                            size_t dictSize,
                            ZSTD_cParamMode_e mode,
                            ZSTD_paramSwitch_e useRowMatchFinder)
{
    const U64 minSrcSize = 513; /* (1<<9) + 1 */
    const U64 maxWindowResize = 1ULL << (ZSTD_WINDOWLOG_MAX-1);
    assert(ZSTD_checkCParams(cPar)==0);

    /* Cascade the selected strategy down to the next-highest one built into
     * this binary. */
#ifdef ZSTD_EXCLUDE_BTULTRA_BLOCK_COMPRESSOR
    if (cPar.strategy == ZSTD_btultra2) {
        cPar.strategy = ZSTD_btultra;
    }
    if (cPar.strategy == ZSTD_btultra) {
        cPar.strategy = ZSTD_btopt;
    }
#endif
#ifdef ZSTD_EXCLUDE_BTOPT_BLOCK_COMPRESSOR
    if (cPar.strategy == ZSTD_btopt) {
        cPar.strategy = ZSTD_btlazy2;
    }
#endif
#ifdef ZSTD_EXCLUDE_BTLAZY2_BLOCK_COMPRESSOR
    if (cPar.strategy == ZSTD_btlazy2) {
        cPar.strategy = ZSTD_lazy2;
    }
#endif
#ifdef ZSTD_EXCLUDE_LAZY2_BLOCK_COMPRESSOR
    if (cPar.strategy == ZSTD_lazy2) {
        cPar.strategy = ZSTD_lazy;
    }
#endif
#ifdef ZSTD_EXCLUDE_LAZY_BLOCK_COMPRESSOR
    if (cPar.strategy == ZSTD_lazy) {
        cPar.strategy = ZSTD_greedy;
    }
#endif
#ifdef ZSTD_EXCLUDE_GREEDY_BLOCK_COMPRESSOR
    if (cPar.strategy == ZSTD_greedy) {
        cPar.strategy = ZSTD_dfast;
    }
#endif
#ifdef ZSTD_EXCLUDE_DFAST_BLOCK_COMPRESSOR
    if (cPar.strategy == ZSTD_dfast) {
        cPar.strategy = ZSTD_fast;
        cPar.targetLength = 0;
    }
#endif

    switch (mode) {
    case ZSTD_cpm_unknown:
    case ZSTD_cpm_noAttachDict:
        /* If we don't know the source size, don't make any
         * assumptions about it. We will already have selected
         * smaller parameters if a dictionary is in use.
         */
        break;
    case ZSTD_cpm_createCDict:
        /* Assume a small source size when creating a dictionary
         * with an unknown source size.
         */
        if (dictSize && srcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            srcSize = minSrcSize;
        break;
    case ZSTD_cpm_attachDict:
        /* Dictionary has its own dedicated parameters which have
         * already been selected. We are selecting parameters
         * for only the source.
         */
        dictSize = 0;
        break;
    default:
        assert(0);
        break;
    }

    /* resize windowLog if input is small enough, to use less memory */
    if ( (srcSize <= maxWindowResize)
      && (dictSize <= maxWindowResize) )  {
        U32 const tSize = (U32)(srcSize + dictSize);
        static U32 const hashSizeMin = 1 << ZSTD_HASHLOG_MIN;
        U32 const srcLog = (tSize < hashSizeMin) ? ZSTD_HASHLOG_MIN :
                            ZSTD_highbit32(tSize-1) + 1;
        if (cPar.windowLog > srcLog) cPar.windowLog = srcLog;
    }
    if (srcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
        U32 const dictAndWindowLog = ZSTD_dictAndWindowLog(cPar.windowLog, (U64)srcSize, (U64)dictSize);
        U32 const cycleLog = ZSTD_cycleLog(cPar.chainLog, cPar.strategy);
        if (cPar.hashLog > dictAndWindowLog+1) cPar.hashLog = dictAndWindowLog+1;
        if (cycleLog > dictAndWindowLog)
            cPar.chainLog -= (cycleLog - dictAndWindowLog);
    }

    if (cPar.windowLog < ZSTD_WINDOWLOG_ABSOLUTEMIN)
        cPar.windowLog = ZSTD_WINDOWLOG_ABSOLUTEMIN;  /* minimum wlog required for valid frame header */

    /* We can't use more than 32 bits of hash in total, so that means that we require:
     * (hashLog + 8) <= 32 && (chainLog + 8) <= 32
     */
    if (mode == ZSTD_cpm_createCDict && ZSTD_CDictIndicesAreTagged(&cPar)) {
        U32 const maxShortCacheHashLog = 32 - ZSTD_SHORT_CACHE_TAG_BITS;
        if (cPar.hashLog > maxShortCacheHashLog) {
            cPar.hashLog = maxShortCacheHashLog;
        }
        if (cPar.chainLog > maxShortCacheHashLog) {
            cPar.chainLog = maxShortCacheHashLog;
        }
    }


    /* At this point, we aren't 100% sure if we are using the row match finder.
     * Unless it is explicitly disabled, conservatively assume that it is enabled.
     * In this case it will only be disabled for small sources, so shrinking the
     * hash log a little bit shouldn't result in any ratio loss.
     */
    if (useRowMatchFinder == ZSTD_ps_auto)
        useRowMatchFinder = ZSTD_ps_enable;

    /* We can't hash more than 32-bits in total. So that means that we require:
     * (hashLog - rowLog + 8) <= 32
     */
    if (ZSTD_rowMatchFinderUsed(cPar.strategy, useRowMatchFinder)) {
        /* Switch to 32-entry rows if searchLog is 5 (or more) */
        U32 const rowLog = BOUNDED(4, cPar.searchLog, 6);
        U32 const maxRowHashLog = 32 - ZSTD_ROW_HASH_TAG_BITS;
        U32 const maxHashLog = maxRowHashLog + rowLog;
        assert(cPar.hashLog >= rowLog);
        if (cPar.hashLog > maxHashLog) {
            cPar.hashLog = maxHashLog;
        }
    }

    return cPar;
}